

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O3

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::clear(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
        *this)

{
  if ((long)this->capacity != 0) {
    operator_delete(this->values,(long)this->capacity << 2);
    this->capacity = 0;
  }
  return;
}

Assistant:

virtual void clear() {
    Notifier* nf = Parent::notifier();
    if (capacity != 0) {
      Item it;
      for (nf->first(it); it != INVALID; nf->next(it)) {
        int id = nf->id(it);
        AllocatorTraits::destroy(allocator, &(values[id]));
      }
      allocator.deallocate(values, capacity);
      capacity = 0;
    }
  }